

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygrep.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *key;
  undefined1 uVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  long lVar5;
  Settings local_40;
  
  name = *argv;
  uVar1 = 0;
  pFVar3 = _stdout;
  while( true ) {
    while (iVar2 = __posix_getopt(argc,argv,"io:"), iVar2 == 0x6f) {
      if (pFVar3 != _stdout) {
        fclose(pFVar3);
      }
      pFVar3 = fopen(_optarg,"w");
    }
    if (iVar2 != 0x69) break;
    uVar1 = 1;
  }
  if (iVar2 == -1) {
    local_40._0_1_ = uVar1;
    local_40.output = (FILE *)pFVar3;
    if (pFVar3 == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR:\t",name);
      fwrite("couldn\'t open output file",0x19,1,_stderr);
      fputc(10,_stderr);
      goto LAB_00101403;
    }
    lVar4 = (long)_optind;
    if (_optind < argc) {
      key = argv[lVar4];
      if (_optind + 1 < argc) {
        iVar2 = argc - _optind;
        lVar5 = 1;
        do {
          pFVar3 = fopen(argv[lVar4 + lVar5],"r");
          handle_file((FILE *)pFVar3,&local_40,key);
          fclose(pFVar3);
          lVar5 = lVar5 + 1;
        } while (iVar2 != (int)lVar5);
      }
      else {
        handle_file(_stdin,&local_40,key);
      }
      exit(0);
    }
  }
  fprintf(_stdout,"USAGE: %s [-i] [-o outfile] keyword [file...]\n",name);
LAB_00101403:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	name = argv[0];

	Settings set = {0, stdout};
	int opt;

	while ((opt = getopt(argc, argv, "io:")) != -1)
	{
		switch (opt)
		{
		case 'i':
			set.i = 1;
			break;
		case 'o':
			if (set.output != stdout)
				fclose(set.output);
			set.output = fopen(optarg, "w");
			break;
		default:
			USAGE();
		}
	}

	if (set.output == NULL)
	{
		ERROR_EXIT("couldn't open output file");
	}

	if (optind >= argc)
	{
		USAGE();
	}
	int i = optind;

	char *key = argv[i];

	i++;

	if (i >= argc)
	{
		handle_file(stdin, &set, key);
	}
	else
	{
		for (; i < argc; i++)
		{

			FILE *input = fopen(argv[i], "r");

			handle_file(input, &set, key);
			fclose(input);
		}
	}
	exit(EXIT_SUCCESS);
}